

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_fill_empty_from_part(REF_INTERP ref_interp,REF_INT *from_part)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_GLOB *pRVar2;
  REF_ADJ pRVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  REF_BOOL again;
  REF_EDGE ref_edge;
  uint local_3c;
  REF_EDGE local_38;
  
  ref_mpi = ref_interp->ref_mpi;
  ref_node = ref_interp->from_grid->node;
  uVar4 = ref_edge_create(&local_38,ref_interp->from_grid);
  if (uVar4 == 0) {
    local_3c = 1;
    iVar7 = 0;
    do {
      if (local_3c == 0) {
        uVar4 = ref_edge_free(local_38);
        if (uVar4 == 0) {
          return 0;
        }
        pcVar10 = "ref_edge free";
        uVar5 = 0xaa7;
        goto LAB_001725e3;
      }
      local_3c = 0;
      if (0 < ref_node->max) {
        uVar4 = 0;
        pRVar2 = ref_node->global;
        lVar6 = 0;
        do {
          if (((-1 < pRVar2[lVar6]) && (ref_node->ref_mpi->id == ref_node->part[lVar6])) &&
             (from_part[lVar6] == -1)) {
            pRVar3 = local_38->adj;
            uVar8 = 0xffffffff;
            if (lVar6 < pRVar3->nnode) {
              uVar8 = (ulong)(uint)pRVar3->first[lVar6];
            }
            if ((int)uVar8 != -1) {
              iVar9 = pRVar3->item[(int)uVar8].ref;
              do {
                if (from_part[(local_38->e2n[iVar9 * 2] - (int)lVar6) + local_38->e2n[iVar9 * 2 + 1]
                             ] != -1) {
                  from_part[lVar6] =
                       from_part[(local_38->e2n[iVar9 * 2] - (int)lVar6) +
                                 local_38->e2n[iVar9 * 2 + 1]];
                  break;
                }
                iVar1 = pRVar3->item[(int)uVar8].next;
                uVar8 = (ulong)iVar1;
                if (uVar8 == 0xffffffffffffffff) {
                  iVar9 = -1;
                }
                else {
                  iVar9 = pRVar3->item[uVar8].ref;
                }
              } while (iVar1 != -1);
            }
            bVar11 = uVar4 == 0;
            uVar4 = 1;
            local_3c = 1;
            if (bVar11) {
              uVar4 = (uint)(from_part[lVar6] == -1);
              local_3c = uVar4;
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < ref_node->max);
      }
      uVar4 = ref_mpi_all_or(ref_mpi,(REF_BOOL *)&local_3c);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xaa1,"ref_interp_fill_empty_from_part",(ulong)uVar4,"mpi all or");
        return uVar4;
      }
      uVar4 = ref_node_ghost_int(ref_node,from_part,1);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xaa2,"ref_interp_fill_empty_from_part",(ulong)uVar4,"ghost from_part");
        return uVar4;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 200);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xaa4,
           "ref_interp_fill_empty_from_part","too many sweeps, stop inf loop");
    uVar4 = 1;
  }
  else {
    pcVar10 = "edges";
    uVar5 = 0xa94;
LAB_001725e3:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar5,
           "ref_interp_fill_empty_from_part",(ulong)uVar4,pcVar10);
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_fill_empty_from_part(REF_INTERP ref_interp,
                                                          REF_INT *from_part) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_BOOL again;
  REF_INT nsweeps, node;
  REF_EDGE ref_edge;

  RSS(ref_edge_create(&ref_edge, from_grid), "edges");

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;
    each_ref_node_valid_node(from_node, node) {
      if (ref_node_owned(from_node, node) && REF_EMPTY == from_part[node]) {
        RSS(ref_interp_from_part_neighbor(ref_edge, from_part, node), "fill");
        again = again || REF_EMPTY == from_part[node];
      }
    }
    RSS(ref_mpi_all_or(ref_mpi, &again), "mpi all or");
    RSS(ref_node_ghost_int(from_node, from_part, 1), "ghost from_part");

    RUS(200, nsweeps, "too many sweeps, stop inf loop");
  }

  RSS(ref_edge_free(ref_edge), "ref_edge free");

  return REF_SUCCESS;
}